

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O2

void __thiscall
TTD::UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::AddArrayLink
          (UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL> *this)

{
  SnapRootInfoEntry *pSVar1;
  UnorderedArrayListLink *pUVar2;
  UnorderedArrayListLink *pUVar3;
  SnapRootInfoEntry *pSVar4;
  
  pUVar3 = (UnorderedArrayListLink *)
           SlabAllocatorBase<0>::SlabAllocateTypeRawSize<32ul>(this->m_alloc);
  pSVar4 = (this->m_inlineHeadBlock).EndPos;
  pSVar1 = (this->m_inlineHeadBlock).BlockData;
  pUVar2 = (this->m_inlineHeadBlock).Next;
  pUVar3->CurrPos = (this->m_inlineHeadBlock).CurrPos;
  pUVar3->EndPos = pSVar4;
  pUVar3->BlockData = pSVar1;
  pUVar3->Next = pUVar2;
  pSVar4 = SlabAllocatorBase<0>::
           SlabAllocateFixedSizeArray<TTD::NSSnapValues::SnapRootInfoEntry,512ul>(this->m_alloc);
  (this->m_inlineHeadBlock).BlockData = pSVar4;
  (this->m_inlineHeadBlock).CurrPos = pSVar4;
  (this->m_inlineHeadBlock).EndPos = pSVar4 + 0x200;
  (this->m_inlineHeadBlock).Next = pUVar3;
  return;
}

Assistant:

void AddArrayLink()
        {
            UnorderedArrayListLink* copiedOldBlock = this->m_alloc->template SlabAllocateStruct<UnorderedArrayListLink>();
            *copiedOldBlock = this->m_inlineHeadBlock;

            T* newBlockData = this->m_alloc->template SlabAllocateFixedSizeArray<T, allocSize>();

            this->m_inlineHeadBlock.BlockData = newBlockData;
            this->m_inlineHeadBlock.CurrPos = newBlockData;
            this->m_inlineHeadBlock.EndPos = newBlockData + allocSize;

            this->m_inlineHeadBlock.Next = copiedOldBlock;
        }